

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeoffsets.cpp
# Opt level: O2

bool __thiscall TimeOffsets::WarnIfOutOfSync(TimeOffsets *this)

{
  Warnings *this_00;
  string_view source_file;
  bilingual_str message;
  bool bVar1;
  seconds sVar2;
  Logger *pLVar3;
  seconds args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  _Variant_storage_alias<kernel::Warning,_node::Warning> in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe94 [44];
  string log_msg;
  bilingual_str msg;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  sVar2 = Median(this);
  args.__r = (rep)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  0x8000000000000001;
  if (-0x7fffffffffffffff < sVar2.__r) {
    args = sVar2;
  }
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)-args.__r;
  if (0 < args.__r) {
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args.__r;
  }
  if (pbVar4 < (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x259) {
    ::node::Warnings::Unset(this->m_warnings,(warning_type)in_stack_fffffffffffffe78);
  }
  else {
    _((bilingual_str *)&log_msg,(ConstevalStringLiteral)0xccba04);
    local_40._M_dataplus._M_p = (pointer)0xa;
    tinyformat::format<long>(&msg,(bilingual_str *)&log_msg,(long *)&local_40);
    bilingual_str::~bilingual_str((bilingual_str *)&log_msg);
    pLVar3 = LogInstance();
    bVar1 = BCLog::Logger::Enabled(pLVar3);
    if (bVar1) {
      log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
      log_msg._M_string_length = 0;
      log_msg.field_2._M_local_buf[0] = '\0';
      tinyformat::format<std::__cxx11::string>
                (&local_40,(tinyformat *)0xe6426b,(char *)&msg,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args.__r);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&log_msg,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      pLVar3 = LogInstance();
      local_40._M_dataplus._M_p = (pointer)0x5d;
      local_40._M_string_length = 0xccb978;
      in_stack_fffffffffffffe78._M_u = (_Variadic_union<kernel::Warning,_node::Warning>)0x5d;
      in_stack_fffffffffffffe78._M_index = '\0';
      in_stack_fffffffffffffe78._5_3_ = 0;
      in_stack_fffffffffffffe80 =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/timeoffsets.cpp"
      ;
      in_stack_fffffffffffffe90 = 3;
      in_stack_fffffffffffffe88 = 0xffffffffffffffff;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/timeoffsets.cpp"
      ;
      source_file._M_len = 0x5d;
      str._M_str = log_msg._M_dataplus._M_p;
      str._M_len = log_msg._M_string_length;
      logging_function._M_str = "WarnIfOutOfSync";
      logging_function._M_len = 0xf;
      BCLog::Logger::LogPrintStr(pLVar3,str,logging_function,source_file,0x3f,ALL,Warning);
      std::__cxx11::string::~string((string *)&log_msg);
    }
    this_00 = this->m_warnings;
    bilingual_str::bilingual_str((bilingual_str *)&stack0xfffffffffffffea0,&msg);
    message.original._M_string_length = in_stack_fffffffffffffe88;
    message.original._M_dataplus._M_p = in_stack_fffffffffffffe80;
    message.original.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffe90;
    message._20_44_ = in_stack_fffffffffffffe94;
    ::node::Warnings::Set(this_00,(warning_type)in_stack_fffffffffffffe78,message);
    bilingual_str::~bilingual_str((bilingual_str *)&stack0xfffffffffffffea0);
    bilingual_str::~bilingual_str(&msg);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x258 < pbVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool TimeOffsets::WarnIfOutOfSync() const
{
    // when median == std::numeric_limits<int64_t>::min(), calling std::chrono::abs is UB
    auto median{std::max(Median(), std::chrono::seconds(std::numeric_limits<int64_t>::min() + 1))};
    if (std::chrono::abs(median) <= WARN_THRESHOLD) {
        m_warnings.Unset(node::Warning::CLOCK_OUT_OF_SYNC);
        return false;
    }

    bilingual_str msg{strprintf(_(
        "Your computer's date and time appear to be more than %d minutes out of sync with the network, "
        "this may lead to consensus failure. After you've confirmed your computer's clock, this message "
        "should no longer appear when you restart your node. Without a restart, it should stop showing "
        "automatically after you've connected to a sufficient number of new outbound peers, which may "
        "take some time. You can inspect the `timeoffset` field of the `getpeerinfo` and `getnetworkinfo` "
        "RPC methods to get more info."
    ), Ticks<std::chrono::minutes>(WARN_THRESHOLD))};
    LogWarning("%s\n", msg.original);
    m_warnings.Set(node::Warning::CLOCK_OUT_OF_SYNC, msg);
    return true;
}